

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
               (string *s,char *fmt,unsigned_short *v,unsigned_short *args,unsigned_short *args_1,
               unsigned_short *args_2,OctahedralVector *args_3,Vector3<float> *args_4,float *args_5,
               uint *args_6,float *args_7,uint *args_8,float *args_9,uint *args_10)

{
  long lVar1;
  ulong uVar2;
  char *in_RCX;
  string *in_RDX;
  float *unaff_RBP;
  string *in_RDI;
  unsigned_short *in_R8;
  unsigned_short *in_R9;
  Vector3<float> *unaff_R15;
  uint *unaff_retaddr;
  float *in_stack_00000008;
  uint *in_stack_00000010;
  string *in_stack_00000018;
  uint *in_stack_00000020;
  string *in_stack_00000028;
  unsigned_short *in_stack_00000038;
  OctahedralVector *in_stack_00000040;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd10;
  char **in_stack_fffffffffffffd18;
  char **in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  Vector3<float> *in_stack_fffffffffffffd30;
  float *in_stack_fffffffffffffd38;
  uint *in_stack_fffffffffffffd40;
  string *psVar3;
  float *in_stack_fffffffffffffd48;
  float *in_stack_fffffffffffffd58;
  uint *in_stack_fffffffffffffd60;
  string local_288 [32];
  char *in_stack_fffffffffffffd98;
  string local_260 [4];
  int in_stack_fffffffffffffda4;
  char *in_stack_fffffffffffffda8;
  LogLevel in_stack_fffffffffffffdb4;
  stringstream local_240 [16];
  undefined1 local_230 [376];
  string local_b8 [32];
  undefined4 local_98;
  undefined1 local_83;
  byte local_82;
  byte local_81;
  string local_80 [16];
  OctahedralVector *in_stack_ffffffffffffff90;
  unsigned_short *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar1 != -1;
  if ((local_81 & 1) == 0) {
    if ((bool)local_83) {
      psVar3 = local_80;
      uVar2 = std::__cxx11::string::find((char)psVar3,100);
      IntegerFormatTrait<unsigned_short>::fmt();
      std::__cxx11::string::replace((ulong)psVar3,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<unsigned_short_const&>
                (in_stack_fffffffffffffd28,(unsigned_short *)in_stack_fffffffffffffd20);
      std::__cxx11::string::operator+=(in_RDI,local_b8);
      std::__cxx11::string::~string(local_b8);
    }
    else if ((local_82 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                 in_stack_fffffffffffffd98);
      }
      std::__cxx11::string::c_str();
      formatOne<unsigned_short_const&>
                (in_stack_fffffffffffffd28,(unsigned_short *)in_stack_fffffffffffffd20);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd58);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_240);
      std::ostream::operator<<(local_230,*(ushort *)in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      std::__cxx11::string::operator+=(in_RDI,local_260);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::stringstream::~stringstream(local_240);
    }
    stringPrintfRecursive<unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,
               (float *)in_stack_00000018,in_stack_00000020);
    local_98 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
              (in_stack_00000028,(char *)in_stack_00000020,in_stack_00000018,
               (unsigned_short *)in_stack_00000010,(unsigned_short *)in_stack_00000008,in_R9,
               in_stack_00000038,in_stack_00000040,in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
               (uint *)&stack0xfffffffffffffce8,in_stack_fffffffffffffd58,in_stack_fffffffffffffd60)
    ;
    local_98 = 1;
  }
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}